

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O2

int __thiscall Emulator::run(Emulator *this)

{
  Console *this_00;
  pointer *__ptr;
  long *local_48;
  thread local_40;
  string local_38 [32];
  
  isRunning = '\x01';
  this_00 = Console::Instance();
  std::__cxx11::string::string(local_38,(string *)&this->filename);
  Console::init(this_00,(EVP_PKEY_CTX *)local_38);
  std::__cxx11::string::~string(local_38);
  local_40._M_id._M_thread = (id)0;
  local_48 = (long *)operator_new(0x10);
  *local_48 = (long)&PTR___State_0011ca58;
  std::thread::_M_start_thread(&local_40,&local_48,0);
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 8))();
  }
  std::thread::operator=(&thread,&local_40);
  std::thread::~thread(&local_40);
  while (isRunning == '\x01') {
    mainLoopStep();
    SDL_Delay(3);
  }
  return 0;
}

Assistant:

int Emulator::run() {
    isRunning = true;
    Console &c = Console::Instance();
    c.init(filename);
    thread = std::thread([&]() { mainLoop(); });
#ifdef __EMSCRIPTEN__
    emscripten_set_keydown_callback(EMSCRIPTEN_EVENT_TARGET_WINDOW, c.getController(), true, keyCallback);
    emscripten_set_keyup_callback(EMSCRIPTEN_EVENT_TARGET_WINDOW, c.getController(), true, keyCallback);
    emscripten_set_main_loop(mainLoopStep, 0, 1);
#else
    while(isRunning) {
        mainLoopStep();
        SDL_Delay(idealFrameTime / 5);
    }
#endif
    return 0;
}